

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

int cmcmd_cmake_ninja_depends(const_iterator argBeg,const_iterator argEnd)

{
  bool bVar1;
  int iVar2;
  Value *pVVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  size_type sVar6;
  string *this;
  cmFortranParser *this_00;
  string *include;
  undefined8 path;
  const_iterator cVar7;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view prefix;
  cmSourceReqInfo src_info;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  string dir_top_bld;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string arg_pp;
  string module_dir;
  string arg_lang;
  string arg_ddi;
  string arg_tdi;
  string arg_obj;
  string arg_dep;
  cmAlphaNum local_640;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_610;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5e0;
  undefined1 local_5c8 [80];
  vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> local_578 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_560;
  bool local_548;
  cmAlphaNum local_540;
  cmFortranSourceInfo finfo;
  string mod;
  optional<(anonymous_namespace)::cmSourceInfo> info;
  cmFortranCompiler fc;
  cmFortranParser parser;
  cmFortranCompiler local_90;
  
  arg_tdi._M_dataplus._M_p = (pointer)&arg_tdi.field_2;
  arg_tdi._M_string_length = 0;
  arg_pp._M_dataplus._M_p = (pointer)&arg_pp.field_2;
  arg_pp._M_string_length = 0;
  arg_tdi.field_2._M_local_buf[0] = '\0';
  arg_dep._M_dataplus._M_p = (pointer)&arg_dep.field_2;
  arg_dep._M_string_length = 0;
  arg_obj._M_dataplus._M_p = (pointer)&arg_obj.field_2;
  arg_obj._M_string_length = 0;
  arg_pp.field_2._M_local_buf[0] = '\0';
  arg_dep.field_2._M_local_buf[0] = '\0';
  arg_ddi._M_dataplus._M_p = (pointer)&arg_ddi.field_2;
  arg_ddi._M_string_length = 0;
  arg_lang._M_dataplus._M_p = (pointer)&arg_lang.field_2;
  arg_lang._M_string_length = 0;
  arg_obj.field_2._M_local_buf[0] = '\0';
  arg_ddi.field_2._M_local_buf[0] = '\0';
  arg_lang.field_2._M_local_buf[0] = '\0';
  iVar2 = 1;
  for (; argBeg._M_current != argEnd._M_current; argBeg._M_current = argBeg._M_current + 1) {
    str._M_str = ((argBeg._M_current)->_M_dataplus)._M_p;
    str._M_len = (argBeg._M_current)->_M_string_length;
    bVar1 = cmHasLiteralPrefix<7ul>(str,(char (*) [7])0x64357f);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&parser,(ulong)argBeg._M_current);
      this = &arg_tdi;
    }
    else {
      str_00._M_str = ((argBeg._M_current)->_M_dataplus)._M_p;
      str_00._M_len = (argBeg._M_current)->_M_string_length;
      bVar1 = cmHasLiteralPrefix<6ul>(str_00,(char (*) [6])0x641e2d);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&parser,(ulong)argBeg._M_current);
        this = &arg_pp;
      }
      else {
        str_01._M_str = ((argBeg._M_current)->_M_dataplus)._M_p;
        str_01._M_len = (argBeg._M_current)->_M_string_length;
        bVar1 = cmHasLiteralPrefix<7ul>(str_01,(char (*) [7])0x641e5d);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)&parser,(ulong)argBeg._M_current);
          this = &arg_dep;
        }
        else {
          str_02._M_str = ((argBeg._M_current)->_M_dataplus)._M_p;
          str_02._M_len = (argBeg._M_current)->_M_string_length;
          bVar1 = cmHasLiteralPrefix<7ul>(str_02,(char (*) [7])0x641e8e);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&parser,(ulong)argBeg._M_current);
            this = &arg_obj;
          }
          else {
            str_03._M_str = ((argBeg._M_current)->_M_dataplus)._M_p;
            str_03._M_len = (argBeg._M_current)->_M_string_length;
            bVar1 = cmHasLiteralPrefix<7ul>(str_03,(char (*) [7])0x643a5d);
            if (bVar1) {
              std::__cxx11::string::substr((ulong)&parser,(ulong)argBeg._M_current);
              this = &arg_ddi;
            }
            else {
              str_04._M_str = ((argBeg._M_current)->_M_dataplus)._M_p;
              str_04._M_len = (argBeg._M_current)->_M_string_length;
              bVar1 = cmHasLiteralPrefix<8ul>(str_04,(char (*) [8])0x642611);
              if (!bVar1) {
                parser.Compiler.Id._M_dataplus._M_p = &DAT_00000029;
                parser.Compiler.Id._M_string_length = (size_type)anon_var_dwarf_111d250;
                finfo.Source._M_string_length = (size_type)((argBeg._M_current)->_M_dataplus)._M_p;
                finfo.Source._M_dataplus._M_p = (pointer)(argBeg._M_current)->_M_string_length;
                cmStrCat<>((string *)&info,(cmAlphaNum *)&parser,(cmAlphaNum *)&finfo);
                cmSystemTools::Error((string *)&info);
                this_00 = (cmFortranParser *)&info;
                goto LAB_00344b37;
              }
              std::__cxx11::string::substr((ulong)&parser,(ulong)argBeg._M_current);
              this = &arg_lang;
            }
          }
        }
      }
    }
    std::__cxx11::string::operator=((string *)this,(string *)&parser);
    std::__cxx11::string::~string((string *)&parser);
  }
  if (arg_tdi._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser,"-E cmake_ninja_depends requires value for --tdi=",
               (allocator<char> *)&finfo);
    cmSystemTools::Error((string *)&parser);
  }
  else if (arg_pp._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser,"-E cmake_ninja_depends requires value for --pp=",
               (allocator<char> *)&finfo);
    cmSystemTools::Error((string *)&parser);
  }
  else if (arg_dep._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser,"-E cmake_ninja_depends requires value for --dep=",
               (allocator<char> *)&finfo);
    cmSystemTools::Error((string *)&parser);
  }
  else if (arg_obj._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser,"-E cmake_ninja_depends requires value for --obj=",
               (allocator<char> *)&finfo);
    cmSystemTools::Error((string *)&parser);
  }
  else if (arg_ddi._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser,"-E cmake_ninja_depends requires value for --ddi=",
               (allocator<char> *)&finfo);
    cmSystemTools::Error((string *)&parser);
  }
  else {
    if (arg_lang._M_string_length != 0) {
      info.super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>._M_payload.
      super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
      super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_engaged = false;
      bVar1 = std::operator==(&arg_lang,"Fortran");
      if (bVar1) {
        fc.Id._M_dataplus._M_p = (pointer)&fc.Id.field_2;
        fc.Id._M_string_length = 0;
        fc.Id.field_2._M_local_buf[0] = '\0';
        fc.SModSep._M_dataplus._M_p = (pointer)&fc.SModSep.field_2;
        fc.SModSep._M_string_length = 0;
        fc.SModSep.field_2._M_local_buf[0] = '\0';
        fc.SModExt._M_dataplus._M_p = (pointer)&fc.SModExt.field_2;
        fc.SModExt._M_string_length = 0;
        local_548 = false;
        fc.SModExt.field_2._M_local_buf[0] = '\0';
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dir_top_bld._M_dataplus._M_p = (pointer)&dir_top_bld.field_2;
        dir_top_bld._M_string_length = 0;
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        dir_top_bld.field_2._M_local_buf[0] = '\0';
        module_dir._M_dataplus._M_p = (pointer)&module_dir.field_2;
        module_dir._M_string_length = 0;
        module_dir.field_2._M_local_buf[0] = '\0';
        Json::Value::Value((Value *)&defines,nullValue);
        std::ifstream::ifstream(&parser,arg_tdi._M_dataplus._M_p,_S_in|_S_bin);
        Json::Reader::Reader((Reader *)&finfo);
        bVar1 = Json::Reader::parse((Reader *)&finfo,(istream *)&parser,(Value *)&defines,false);
        if (bVar1) {
          Json::Reader::~Reader((Reader *)&finfo);
          std::ifstream::~ifstream(&parser);
          pVVar3 = Json::Value::operator[]((Value *)&defines,"dir-top-bld");
          Json::Value::asString_abi_cxx11_((String *)&parser,pVVar3);
          std::__cxx11::string::operator=((string *)&dir_top_bld,(string *)&parser);
          std::__cxx11::string::~string((string *)&parser);
          if (dir_top_bld._M_string_length != 0) {
            str_05._M_str = dir_top_bld._M_dataplus._M_p;
            str_05._M_len = dir_top_bld._M_string_length;
            bVar1 = cmHasLiteralSuffix<2ul>(str_05,(char (*) [2])0x679c62);
            if (!bVar1) {
              std::__cxx11::string::push_back((char)&dir_top_bld);
            }
          }
          pVVar3 = Json::Value::operator[]((Value *)&defines,"include-dirs");
          bVar1 = Json::Value::isArray(pVVar3);
          if (bVar1) {
            cVar7 = Json::Value::begin(pVVar3);
            finfo.Source._M_dataplus._M_p = (pointer)cVar7.super_ValueIteratorBase.current_._M_node;
            finfo.Source._M_string_length =
                 CONCAT71(finfo.Source._M_string_length._1_7_,cVar7.super_ValueIteratorBase.isNull_)
            ;
            cVar7 = Json::Value::end(pVVar3);
            src_info.LogicalName._M_dataplus._M_p =
                 (pointer)cVar7.super_ValueIteratorBase.current_._M_node;
            src_info.LogicalName._M_string_length =
                 CONCAT71(src_info.LogicalName._M_string_length._1_7_,
                          cVar7.super_ValueIteratorBase.isNull_);
            while( true ) {
              bVar1 = Json::ValueIteratorBase::operator!=
                                ((ValueIteratorBase *)&finfo,(SelfType *)&src_info);
              if (!bVar1) break;
              pVVar3 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&finfo);
              Json::Value::asString_abi_cxx11_((String *)&parser,pVVar3);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &includes,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parser);
              std::__cxx11::string::~string((string *)&parser);
              Json::ValueIteratorBase::increment((ValueIteratorBase *)&finfo);
            }
          }
          pVVar3 = Json::Value::operator[]((Value *)&defines,"module-dir");
          Json::Value::asString_abi_cxx11_((String *)&parser,pVVar3);
          std::__cxx11::string::operator=((string *)&module_dir,(string *)&parser);
          std::__cxx11::string::~string((string *)&parser);
          if (module_dir._M_string_length != 0) {
            str_06._M_str = module_dir._M_dataplus._M_p;
            str_06._M_len = module_dir._M_string_length;
            bVar1 = cmHasLiteralSuffix<2ul>(str_06,(char (*) [2])0x679c62);
            if (!bVar1) {
              std::__cxx11::string::push_back('\0');
            }
          }
          pVVar3 = Json::Value::operator[]((Value *)&defines,"compiler-id");
          Json::Value::asString_abi_cxx11_((String *)&parser,pVVar3);
          std::__cxx11::string::operator=((string *)&fc,(string *)&parser);
          std::__cxx11::string::~string((string *)&parser);
          pVVar3 = Json::Value::operator[]((Value *)&defines,"submodule-sep");
          Json::Value::asString_abi_cxx11_((String *)&parser,pVVar3);
          std::__cxx11::string::operator=((string *)&fc.SModSep,(string *)&parser);
          std::__cxx11::string::~string((string *)&parser);
          pVVar3 = Json::Value::operator[]((Value *)&defines,"submodule-ext");
          Json::Value::asString_abi_cxx11_((String *)&parser,pVVar3);
          std::__cxx11::string::operator=((string *)&fc.SModExt,(string *)&parser);
          std::__cxx11::string::~string((string *)&parser);
          Json::Value::~Value((Value *)&defines);
          finfo.Source._M_dataplus._M_p = (pointer)&finfo.Source.field_2;
          finfo.Source._M_string_length = 0;
          finfo.Source.field_2._M_local_buf[0] = '\0';
          finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_header;
          finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          finfo.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &finfo.Requires._M_t._M_impl.super__Rb_tree_header._M_header;
          finfo.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          finfo.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          finfo.Requires._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          finfo.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &finfo.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header;
          finfo.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          finfo.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          finfo.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_header;
          finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &defines._M_t._M_impl.super__Rb_tree_header._M_header;
          defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          defines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          defines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          defines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          finfo.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               finfo.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          finfo.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               finfo.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          cmFortranCompiler::cmFortranCompiler(&local_90,&fc);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_5e0,&includes);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree(&local_610,&defines._M_t);
          cmFortranParser_s::cmFortranParser_s
                    (&parser,&local_90,&local_5e0,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_610,&finfo);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_610);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5e0);
          cmFortranCompiler::~cmFortranCompiler(&local_90);
          bVar1 = cmFortranParser_FilePush(&parser,arg_pp._M_dataplus._M_p);
          if (bVar1) {
            iVar2 = cmFortran_yyparse(parser.Scanner);
            if (iVar2 == 0) {
              src_info.LogicalName._M_dataplus._M_p = (pointer)&src_info.LogicalName.field_2;
              src_info.LogicalName.field_2._M_allocated_capacity = 0;
              src_info.LogicalName.field_2._8_8_ = 0;
              src_info.LogicalName._M_string_length = 0;
              src_info.SourcePath._M_dataplus._M_p = (pointer)0x0;
              src_info.SourcePath._M_string_length = 0;
              src_info.SourcePath.field_2._M_allocated_capacity = 0;
              src_info.SourcePath.field_2._8_8_ = 0;
              src_info.CompiledModulePath._M_dataplus._M_p = (pointer)0x0;
              src_info.CompiledModulePath._M_string_length = 0;
              src_info.CompiledModulePath.field_2._M_allocated_capacity = 0;
              src_info.CompiledModulePath.field_2._8_8_ = 0;
              src_info.UseSourcePath = false;
              src_info.IsInterface = false;
              src_info._98_2_ = 0;
              src_info.Method = ByName;
              if (local_548 == true) {
                anon_unknown.dwarf_111f1cb::cmSourceInfo::operator=
                          ((cmSourceInfo *)local_5c8,(cmSourceInfo *)&src_info);
              }
              else {
                std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::
                _M_construct<(anonymous_namespace)::cmSourceInfo>
                          ((_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)local_5c8,
                           (cmSourceInfo *)&src_info);
              }
              anon_unknown.dwarf_111f1cb::cmSourceInfo::~cmSourceInfo((cmSourceInfo *)&src_info);
              for (p_Var5 = finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var5 != &finfo.Provides._M_t._M_impl.super__Rb_tree_header;
                  p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
                src_info.LogicalName._M_dataplus._M_p = (pointer)&src_info.LogicalName.field_2;
                src_info.LogicalName._M_string_length = 0;
                src_info.LogicalName.field_2._M_allocated_capacity =
                     src_info.LogicalName.field_2._M_allocated_capacity & 0xffffffffffffff00;
                src_info.SourcePath._M_dataplus._M_p = (pointer)&src_info.SourcePath.field_2;
                src_info.SourcePath._M_string_length = 0;
                src_info.SourcePath.field_2._M_allocated_capacity =
                     src_info.SourcePath.field_2._M_allocated_capacity & 0xffffffffffffff00;
                src_info.CompiledModulePath._M_dataplus._M_p =
                     (pointer)&src_info.CompiledModulePath.field_2;
                src_info.CompiledModulePath._M_string_length = 0;
                src_info.CompiledModulePath.field_2._M_allocated_capacity =
                     src_info.CompiledModulePath.field_2._M_allocated_capacity & 0xffffffffffffff00;
                src_info.UseSourcePath = false;
                src_info.IsInterface = true;
                src_info._96_8_ = src_info._96_8_ & 0xffffffff;
                std::__cxx11::string::_M_assign((string *)&src_info);
                if (module_dir._M_string_length != 0) {
                  local_640.View_._M_len = module_dir._M_string_length;
                  local_640.View_._M_str = module_dir._M_dataplus._M_p;
                  local_540.View_._M_str = *(char **)(p_Var5 + 1);
                  local_540.View_._M_len = (size_t)p_Var5[1]._M_parent;
                  cmStrCat<>(&mod,&local_640,&local_540);
                  if (dir_top_bld._M_string_length != 0) {
                    str_07._M_str = mod._M_dataplus._M_p;
                    str_07._M_len = mod._M_string_length;
                    prefix._M_str = dir_top_bld._M_dataplus._M_p;
                    prefix._M_len = dir_top_bld._M_string_length;
                    bVar1 = cmHasPrefix(str_07,prefix);
                    if (bVar1) {
                      std::__cxx11::string::substr((ulong)&local_640,(ulong)&mod);
                      std::__cxx11::string::operator=((string *)&mod,(string *)&local_640);
                      std::__cxx11::string::~string((string *)&local_640);
                    }
                  }
                  std::__cxx11::string::operator=
                            ((string *)&src_info.CompiledModulePath,(string *)&mod);
                  std::__cxx11::string::~string((string *)&mod);
                }
                std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
                emplace_back<cmSourceReqInfo&>
                          ((vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *)
                           (local_5c8 + 0x38),&src_info);
                cmSourceReqInfo::~cmSourceReqInfo(&src_info);
              }
              for (p_Var5 = finfo.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var5 != &finfo.Requires._M_t._M_impl.super__Rb_tree_header;
                  p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
                sVar6 = std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(&finfo.Provides,(key_type *)(p_Var5 + 1));
                if (sVar6 == 0) {
                  src_info.LogicalName._M_dataplus._M_p = (pointer)&src_info.LogicalName.field_2;
                  src_info.LogicalName._M_string_length = 0;
                  src_info.LogicalName.field_2._M_allocated_capacity =
                       src_info.LogicalName.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  src_info.SourcePath._M_dataplus._M_p = (pointer)&src_info.SourcePath.field_2;
                  src_info.SourcePath._M_string_length = 0;
                  src_info.SourcePath.field_2._M_allocated_capacity =
                       src_info.SourcePath.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  src_info.CompiledModulePath._M_dataplus._M_p =
                       (pointer)&src_info.CompiledModulePath.field_2;
                  src_info.CompiledModulePath._M_string_length = 0;
                  src_info.CompiledModulePath.field_2._M_allocated_capacity =
                       src_info.CompiledModulePath.field_2._M_allocated_capacity &
                       0xffffffffffffff00;
                  src_info.UseSourcePath = false;
                  src_info.IsInterface = true;
                  src_info._96_8_ = src_info._96_8_ & 0xffffffff;
                  std::__cxx11::string::_M_assign((string *)&src_info);
                  std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
                  emplace_back<cmSourceReqInfo&>(local_578,&src_info);
                  cmSourceReqInfo::~cmSourceReqInfo(&src_info);
                }
              }
              for (p_Var5 = finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var5 != &finfo.Includes._M_t._M_impl.super__Rb_tree_header;
                  p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_560,(value_type *)(p_Var5 + 1));
              }
            }
          }
          else {
            src_info.LogicalName._M_dataplus._M_p = (pointer)0x26;
            src_info.LogicalName._M_string_length = (size_type)anon_var_dwarf_111dfd8;
            local_640.View_._M_len = arg_pp._M_string_length;
            local_640.View_._M_str = arg_pp._M_dataplus._M_p;
            cmStrCat<>((string *)&local_540,(cmAlphaNum *)&src_info,&local_640);
            cmSystemTools::Error((string *)&local_540);
            std::__cxx11::string::~string((string *)&local_540);
          }
          cmFortranParser_s::~cmFortranParser_s(&parser);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&defines._M_t);
          cmFortranSourceInfo::~cmFortranSourceInfo(&finfo);
        }
        else {
          src_info.LogicalName._M_dataplus._M_p = (pointer)0x27;
          src_info.LogicalName._M_string_length = (size_type)anon_var_dwarf_111df97;
          local_90.Id._M_dataplus._M_p = (pointer)arg_tdi._M_string_length;
          local_90.Id._M_string_length = (size_type)arg_tdi._M_dataplus._M_p;
          Json::Reader::getFormattedErrorMessages_abi_cxx11_((String *)&local_640,(Reader *)&finfo);
          cmStrCat<std::__cxx11::string>
                    ((string *)&local_610,(cmAlphaNum *)&src_info,(cmAlphaNum *)&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_640
                    );
          cmSystemTools::Error((string *)&local_610);
          std::__cxx11::string::~string((string *)&local_610);
          std::__cxx11::string::~string((string *)&local_640);
          Json::Reader::~Reader((Reader *)&finfo);
          std::ifstream::~ifstream(&parser);
          Json::Value::~Value((Value *)&defines);
        }
        std::__cxx11::string::~string((string *)&module_dir);
        std::__cxx11::string::~string((string *)&dir_top_bld);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&includes);
        cmFortranCompiler::~cmFortranCompiler(&fc);
        if (info.super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>._M_payload.
            super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
            super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_engaged == true) {
          if ((local_548 & 1U) == 0) {
LAB_00345123:
            std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::_M_reset
                      ((_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)&info);
          }
          else {
            anon_unknown.dwarf_111f1cb::cmSourceInfo::operator=
                      ((cmSourceInfo *)&info,(cmSourceInfo *)local_5c8);
          }
        }
        else {
          if ((local_548 & 1U) == 0) goto LAB_00345123;
          std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::
          _M_construct<(anonymous_namespace)::cmSourceInfo>
                    ((_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)&info,
                     (cmSourceInfo *)local_5c8);
        }
        std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::_M_reset
                  ((_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)local_5c8);
        iVar2 = 1;
        if (info.super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>._M_payload.
            super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
            super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_engaged != false) {
          std::__cxx11::string::_M_assign((string *)&info);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&parser,&arg_dep,false,None);
          cmsys::SystemTools::ConvertToUnixOutputPath(&finfo.Source,&arg_pp);
          poVar4 = std::operator<<((ostream *)&parser,(string *)&finfo);
          std::operator<<(poVar4,":");
          std::__cxx11::string::~string((string *)&finfo);
          for (path = info.super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>.
                      _M_payload.
                      super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                      .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload.
                      _M_value.Includes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
              (pointer)path !=
              info.super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>.
              _M_payload.
              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>.
              super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>._M_payload._M_value.
              Includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; path = path + 0x20) {
            poVar4 = std::operator<<((ostream *)&parser," \\\n ");
            cmsys::SystemTools::ConvertToUnixOutputPath(&finfo.Source,(string *)path);
            std::operator<<(poVar4,(string *)&finfo);
            std::__cxx11::string::~string((string *)&finfo);
          }
          std::operator<<((ostream *)&parser,"\n");
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&parser);
          bVar1 = cmScanDepFormat_P1689_Write(&arg_ddi,(cmScanDepInfo *)&info);
          iVar2 = 0;
          if (!bVar1) {
            parser.Compiler.Id._M_dataplus._M_p = (pointer)0x27;
            parser.Compiler.Id._M_string_length = (size_type)anon_var_dwarf_111d2d2;
            finfo.Source._M_dataplus._M_p = (pointer)arg_ddi._M_string_length;
            finfo.Source._M_string_length = (size_type)arg_ddi._M_dataplus._M_p;
            cmStrCat<>((string *)local_5c8,(cmAlphaNum *)&parser,(cmAlphaNum *)&finfo);
            cmSystemTools::Error((string *)local_5c8);
            goto LAB_00344c4f;
          }
        }
      }
      else {
        parser.Compiler.Id._M_dataplus._M_p = (pointer)0x2f;
        parser.Compiler.Id._M_string_length = (size_type)anon_var_dwarf_111d2ab;
        finfo.Source._M_dataplus._M_p = (pointer)arg_lang._M_string_length;
        finfo.Source._M_string_length = (size_type)arg_lang._M_dataplus._M_p;
        cmStrCat<char[10]>((string *)local_5c8,(cmAlphaNum *)&parser,(cmAlphaNum *)&finfo,
                           (char (*) [10])0x61c904);
        cmSystemTools::Error((string *)local_5c8);
LAB_00344c4f:
        std::__cxx11::string::~string((string *)local_5c8);
        iVar2 = 1;
      }
      std::_Optional_payload_base<(anonymous_namespace)::cmSourceInfo>::_M_reset
                ((_Optional_payload_base<(anonymous_namespace)::cmSourceInfo> *)&info);
      goto LAB_00344b3c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser,"-E cmake_ninja_depends requires value for --lang=",
               (allocator<char> *)&finfo);
    cmSystemTools::Error((string *)&parser);
  }
  this_00 = &parser;
LAB_00344b37:
  std::__cxx11::string::~string((string *)this_00);
LAB_00344b3c:
  std::__cxx11::string::~string((string *)&arg_lang);
  std::__cxx11::string::~string((string *)&arg_ddi);
  std::__cxx11::string::~string((string *)&arg_obj);
  std::__cxx11::string::~string((string *)&arg_dep);
  std::__cxx11::string::~string((string *)&arg_pp);
  std::__cxx11::string::~string((string *)&arg_tdi);
  return iVar2;
}

Assistant:

int cmcmd_cmake_ninja_depends(std::vector<std::string>::const_iterator argBeg,
                              std::vector<std::string>::const_iterator argEnd)
{
  std::string arg_tdi;
  std::string arg_pp;
  std::string arg_dep;
  std::string arg_obj;
  std::string arg_ddi;
  std::string arg_lang;
  for (std::string const& arg : cmMakeRange(argBeg, argEnd)) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--pp=")) {
      arg_pp = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--dep=")) {
      arg_dep = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--obj=")) {
      arg_obj = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--ddi=")) {
      arg_ddi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else {
      cmSystemTools::Error(
        cmStrCat("-E cmake_ninja_depends unknown argument: ", arg));
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --tdi=");
    return 1;
  }
  if (arg_pp.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --pp=");
    return 1;
  }
  if (arg_dep.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --dep=");
    return 1;
  }
  if (arg_obj.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --obj=");
    return 1;
  }
  if (arg_ddi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --ddi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --lang=");
    return 1;
  }

  cm::optional<cmSourceInfo> info;
  if (arg_lang == "Fortran") {
    info = cmcmd_cmake_ninja_depends_fortran(arg_tdi, arg_pp);
  } else {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_depends does not understand the ", arg_lang,
               " language"));
    return 1;
  }

  if (!info) {
    // The error message is already expected to have been output.
    return 1;
  }

  info->ScanDep.PrimaryOutput = arg_obj;

  {
    cmGeneratedFileStream depfile(arg_dep);
    depfile << cmSystemTools::ConvertToUnixOutputPath(arg_pp) << ":";
    for (std::string const& include : info->Includes) {
      depfile << " \\\n " << cmSystemTools::ConvertToUnixOutputPath(include);
    }
    depfile << "\n";
  }

  if (!cmScanDepFormat_P1689_Write(arg_ddi, info->ScanDep)) {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_depends failed to write ", arg_ddi));
    return 1;
  }
  return 0;
}